

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_message.cc
# Opt level: O3

void __thiscall
absl::log_internal::LogMessage::CopyToEncodedBuffer<(absl::log_internal::LogMessage::StringType)1>
          (LogMessage *this,string_view str)

{
  LogMessageData *pLVar1;
  bool bVar2;
  Span<char> *in_R8;
  Span<char> msg;
  Span<const_char> value;
  Span<char> encoded_remaining_copy;
  Span<char> local_48;
  
  pLVar1 = (this->data_)._M_t.
           super___uniq_ptr_impl<absl::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::log_internal::LogMessage::LogMessageData>_>
           ._M_t.
           super__Tuple_impl<0UL,_absl::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::log_internal::LogMessage::LogMessageData>_>
           .super__Head_base<0UL,_absl::log_internal::LogMessage::LogMessageData_*,_false>.
           _M_head_impl;
  local_48.ptr_ = (pLVar1->encoded_remaining).ptr_;
  local_48.len_ = (pLVar1->encoded_remaining).len_;
  msg = EncodeMessageStart(7,(uint64_t)((pointer)str._M_len + 0x14),&local_48);
  value.len_ = (size_type)&local_48;
  value.ptr_ = (pointer)str._M_len;
  bVar2 = EncodeBytesTruncate((log_internal *)0x1,(uint64_t)str._M_str,value,in_R8);
  if (bVar2) {
    EncodeMessageLength(msg,&local_48);
    pLVar1 = (this->data_)._M_t.
             super___uniq_ptr_impl<absl::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::log_internal::LogMessage::LogMessageData>_>
             ._M_t.
             super__Tuple_impl<0UL,_absl::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::log_internal::LogMessage::LogMessageData>_>
             .super__Head_base<0UL,_absl::log_internal::LogMessage::LogMessageData_*,_false>.
             _M_head_impl;
    (pLVar1->encoded_remaining).ptr_ = local_48.ptr_;
    (pLVar1->encoded_remaining).len_ = local_48.len_;
  }
  else {
    (((this->data_)._M_t.
      super___uniq_ptr_impl<absl::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::log_internal::LogMessage::LogMessageData>_>
      ._M_t.
      super__Tuple_impl<0UL,_absl::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::log_internal::LogMessage::LogMessageData>_>
      .super__Head_base<0UL,_absl::log_internal::LogMessage::LogMessageData_*,_false>._M_head_impl)
    ->encoded_remaining).len_ = 0;
  }
  return;
}

Assistant:

void LogMessage::CopyToEncodedBuffer(absl::string_view str) {
  auto encoded_remaining_copy = data_->encoded_remaining;
  auto start = EncodeMessageStart(
      EventTag::kValue, BufferSizeFor(WireType::kLengthDelimited) + str.size(),
      &encoded_remaining_copy);
  // If the `logging.proto.Event.value` field header did not fit,
  // `EncodeMessageStart` will have zeroed `encoded_remaining_copy`'s size and
  // `EncodeStringTruncate` will fail too.
  if (EncodeStringTruncate(str_type == StringType::kLiteral
                               ? ValueTag::kStringLiteral
                               : ValueTag::kString,
                           str, &encoded_remaining_copy)) {
    // The string may have been truncated, but the field header fit.
    EncodeMessageLength(start, &encoded_remaining_copy);
    data_->encoded_remaining = encoded_remaining_copy;
  } else {
    // The field header(s) did not fit; zero `encoded_remaining` so we don't
    // write anything else later.
    data_->encoded_remaining.remove_suffix(data_->encoded_remaining.size());
  }
}